

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfasttext.cc
# Opt level: O1

fasttext_vocab_t * cft_fasttext_get_vocab(fasttext_t *handle)

{
  fasttext_vocab_t *pfVar1;
  _Alloc_hider _Var2;
  char **ppcVar3;
  int64_t *piVar4;
  char *pcVar5;
  ulong uVar6;
  size_t __size;
  vector<long,_std::allocator<long>_> vocab_freq;
  shared_ptr<const_fasttext::Dictionary> d;
  string word;
  vector<long,_std::allocator<long>_> local_80;
  fasttext_vocab_t *local_68;
  Dictionary *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  string local_50;
  
  fasttext::FastText::getDictionary((FastText *)handle);
  fasttext::Dictionary::getCounts(&local_80,local_60,word);
  __size = (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
  local_68 = (fasttext_vocab_t *)malloc(0x18);
  local_68->length = (long)__size >> 3;
  ppcVar3 = (char **)malloc(__size);
  piVar4 = (int64_t *)malloc(__size);
  if (local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar6 = 0;
    do {
      fasttext::Dictionary::getWord_abi_cxx11_(&local_50,local_60,(int32_t)uVar6);
      _Var2._M_p = local_50._M_dataplus._M_p;
      pcVar5 = strdup(local_50._M_dataplus._M_p);
      ppcVar3[uVar6] = pcVar5;
      piVar4[uVar6] =
           local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_start[uVar6];
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var2._M_p != &local_50.field_2) {
        operator_delete(_Var2._M_p);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)((long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 3));
  }
  pfVar1 = local_68;
  local_68->words = ppcVar3;
  local_68->freqs = piVar4;
  if (local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  return pfVar1;
}

Assistant:

fasttext_vocab_t* cft_fasttext_get_vocab(fasttext_t* handle) {
    std::shared_ptr<const fasttext::Dictionary> d = ((FastText*)handle)->getDictionary();
    std::vector<int64_t> vocab_freq = d->getCounts(fasttext::entry_type::word);
    size_t len = vocab_freq.size();

    fasttext_vocab_t* ret = static_cast<fasttext_vocab_t*>(malloc(sizeof(fasttext_vocab_t)));
    ret->length = len;
    char** words = static_cast<char**>(malloc(sizeof(char*) * len));
    int64_t* freqs = static_cast<int64_t*>(malloc(sizeof(int64_t) * len));
    for (int32_t i = 0; i < vocab_freq.size(); i++) {
        std::string word = d->getWord(i);
        words[i] = strdup(word.c_str());
        freqs[i] = vocab_freq[i];
    }
    ret->words = words;
    ret->freqs = freqs;
    return ret;
}